

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> __thiscall
capnp::SchemaLoader::Impl::copyDeduped<capnp::_::RawBrandedSchema::Dependency>
          (Impl *this,ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> values)

{
  Maybe<kj::ArrayPtr<const_unsigned_char>_&> MVar1;
  size_t size;
  ArrayPtr<capnp::_::RawBrandedSchema::Dependency> AVar2;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar3;
  ArrayPtr<const_unsigned_char> bytes;
  ArrayPtr<const_unsigned_char> local_48;
  ArrayPtr<const_unsigned_char> local_38;
  
  size = values.size_;
  if (size == 0) {
    AVar2 = (ArrayPtr<capnp::_::RawBrandedSchema::Dependency>)ZEXT816(0);
  }
  else {
    local_38.ptr = (uchar *)values.ptr;
    local_38.size_ = size << 4;
    MVar1 = kj::Table<kj::ArrayPtr<unsigned_char_const>,kj::HashIndex<kj::_::HashSetCallbacks>>::
            find<0ul,kj::ArrayPtr<unsigned_char_const>&>
                      ((Table<kj::ArrayPtr<unsigned_char_const>,kj::HashIndex<kj::_::HashSetCallbacks>>
                        *)&this->dedupTable,&local_38);
    if (MVar1.ptr == (ArrayPtr<const_unsigned_char> *)0x0) {
      AVar2 = kj::Arena::allocateArray<capnp::_::RawBrandedSchema::Dependency>(&this->arena,size);
      memcpy(AVar2.ptr,values.ptr,size << 4);
      local_48.size_ = AVar2.size_ << 4;
      local_48.ptr = (uchar *)AVar2.ptr;
      kj::Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>::insert
                (&(this->dedupTable).
                  super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
                 ,&local_48);
    }
    else {
      AVar2.size_ = size;
      AVar2.ptr = (Dependency *)(MVar1.ptr)->ptr;
    }
  }
  AVar3.ptr = AVar2.ptr;
  AVar3.size_ = AVar2.size_;
  return AVar3;
}

Assistant:

kj::ArrayPtr<const T> SchemaLoader::Impl::copyDeduped(kj::ArrayPtr<const T> values) {
  if (values.size() == 0) {
    return kj::arrayPtr(kj::implicitCast<const T*>(nullptr), 0);
  }

  auto bytes = values.asBytes();

  KJ_IF_MAYBE(dupe, dedupTable.find(bytes)) {
    return kj::arrayPtr(reinterpret_cast<const T*>(dupe->begin()), values.size());
  }

  // Need to make a new copy.
  auto copy = arena.allocateArray<T>(values.size());
  memcpy(copy.begin(), values.begin(), values.size() * sizeof(T));

  dedupTable.insert(copy.asBytes());

  return copy;
}